

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O1

void __thiscall
PermutazioneST::randomBS
          (PermutazioneST *this,PermutazioneST *p,uint limiteTrasposizioni,unsigned_short *risultato
          )

{
  ushort uVar1;
  unsigned_short uVar2;
  unsigned_short *puVar3;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  ushort uVar9;
  ulong uVar10;
  bool bVar11;
  PermutazioneST pCopia;
  uniform_int_distribution<int> local_58;
  unsigned_short *local_50;
  Permutazione local_48;
  
  local_50 = risultato;
  Permutazione::Permutazione
            (&local_48,(p->super_Permutazione).individuo,(p->super_Permutazione).dimensione);
  local_48._vptr_Permutazione = (_func_int **)&PTR__Permutazione_0010dce0;
  uVar1 = (p->super_Permutazione).dimensione;
  pvVar5 = operator_new__(-(ulong)(uVar1 == 0) | (ulong)uVar1 * 2 - 2);
  if (uVar1 < 2) {
    uVar9 = 0;
  }
  else {
    puVar3 = (p->super_Permutazione).individuo;
    uVar8 = 0;
    uVar9 = 0;
    do {
      if (puVar3[uVar8 + 1] < puVar3[uVar8]) {
        uVar10 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        *(short *)((long)pvVar5 + uVar10 * 2) = (short)uVar8;
      }
      uVar8 = uVar8 + 1;
    } while (uVar1 - 1 != uVar8);
  }
  if (limiteTrasposizioni != 0 && uVar9 != 0) {
    uVar8 = 1;
    do {
      local_58._M_param._M_b = uVar9 - 1;
      local_58._M_param._M_a = 0;
      uVar4 = std::uniform_int_distribution<int>::operator()
                        (&local_58,&genRand.gen,&local_58._M_param);
      uVar1 = *(ushort *)((long)pvVar5 + (ulong)(uVar4 & 0xffff) * 2);
      uVar6 = uVar1 + 1;
      uVar7 = uVar9 - 1;
      local_50[uVar8 - 1] = uVar1;
      uVar2 = local_48.individuo[uVar1];
      local_48.individuo[uVar1] = local_48.individuo[uVar6];
      local_48.individuo[uVar6] = uVar2;
      *(undefined2 *)((long)pvVar5 + (ulong)(uVar4 & 0xffff) * 2) =
           *(undefined2 *)((long)pvVar5 + (ulong)uVar7 * 2);
      if (uVar1 != 0) {
        uVar4 = uVar1 - 1;
        if ((local_48.individuo[uVar1] < local_48.individuo[uVar4]) &&
           (local_48.individuo[uVar4] < local_48.individuo[(ulong)uVar1 + 1])) {
          *(short *)((long)pvVar5 + (ulong)uVar7 * 2) = (short)uVar4;
          uVar7 = uVar9;
        }
      }
      uVar9 = uVar7;
      if (((uVar1 + 2 < (uint)(p->super_Permutazione).dimensione) &&
          (local_48.individuo[(ulong)uVar1 + 2] < local_48.individuo[(ulong)uVar1 + 1])) &&
         (local_48.individuo[uVar1] < local_48.individuo[(ulong)uVar1 + 2])) {
        *(short *)((long)pvVar5 + (ulong)uVar7 * 2) = (short)uVar6;
        uVar9 = uVar7 + 1;
      }
    } while ((uVar9 != 0) && (bVar11 = uVar8 < limiteTrasposizioni, uVar8 = uVar8 + 1, bVar11));
  }
  operator_delete__(pvVar5);
  Permutazione::~Permutazione(&local_48);
  return;
}

Assistant:

void PermutazioneST::randomBS(PermutazioneST& p, unsigned int limiteTrasposizioni, unsigned short* risultato) {

	PermutazioneST pCopia(p.individuo, p.dimensione);

	unsigned short* zeta = new unsigned short[p.dimensione - 1];
	unsigned short cursoreZeta = 0;

	unsigned int cursoreTrasposizioni = 0;
	unsigned int contatoreTrasposizioni = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		if (p.individuo[i] > p.individuo[i + 1])
			zeta[cursoreZeta++] = i;
	}

	unsigned short random, randomZeta, temp;

	while (cursoreZeta > 0 && contatoreTrasposizioni < limiteTrasposizioni) {

		random = genRand.randIntU(0, cursoreZeta - 1);
		randomZeta = zeta[random];

		risultato[contatoreTrasposizioni++] = randomZeta;


		temp = pCopia.individuo[randomZeta];
		pCopia.individuo[randomZeta] = pCopia.individuo[randomZeta + 1];
		pCopia.individuo[randomZeta + 1] = temp;

		zeta[random] = zeta[--cursoreZeta];

		if (randomZeta > 0 && pCopia.individuo[randomZeta - 1] > pCopia.individuo[randomZeta] &&
			pCopia.individuo[randomZeta - 1] < pCopia.individuo[randomZeta + 1])
			zeta[cursoreZeta++] = randomZeta - 1;

		if (randomZeta + 2 < p.dimensione && pCopia.individuo[randomZeta + 1] > pCopia.individuo[randomZeta + 2] &&
			pCopia.individuo[randomZeta] < pCopia.individuo[randomZeta + 2])
			zeta[cursoreZeta++] = randomZeta + 1;

	}

	delete[] zeta;
}